

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

Validity * __thiscall kj::TestRunner::run(Validity *__return_storage_ptr__,TestRunner *this)

{
  byte bVar1;
  ProcessContext *pPVar2;
  char (*pacVar3) [16];
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char (*params_1) [16];
  Iterator __begin3;
  size_t sVar8;
  Exception *params;
  char *pcVar9;
  char (*params_3) [6];
  undefined1 auVar10 [16];
  undefined7 uStack_338;
  bool currentFailed;
  uint failCount;
  uint passCount;
  char (*local_328) [16];
  String name;
  TestRunner *local_308;
  char (**local_300) [16];
  bool *local_2f8;
  String message;
  char *local_190;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 local_188;
  
  pacVar3 = (anonymous_namespace)::testCasesHead;
  if ((anonymous_namespace)::testCasesHead == (char (*) [16])0x0) {
    MainBuilder::Validity::Validity(__return_storage_ptr__,"no tests were declared");
    return __return_storage_ptr__;
  }
  pcVar9 = *(char **)(*(anonymous_namespace)::testCasesHead + 8);
  sVar5 = strlen(pcVar9);
  for (params_1 = pacVar3; params_1 != (char (*) [16])0x0; params_1 = *(char (**) [16])params_1[2])
  {
    for (sVar8 = 0;
        (sVar6 = sVar5, sVar5 != sVar8 &&
        (sVar6 = sVar8, *(char *)(*(long *)(*params_1 + 8) + sVar8) == pcVar9[sVar8]));
        sVar8 = sVar8 + 1) {
    }
    sVar5 = sVar6;
  }
  while (sVar8 = sVar5, sVar8 != 0) {
    bVar1 = pcVar9[sVar8 - 1];
    params_1 = (char (*) [16])(ulong)bVar1;
    if ((bVar1 == 0x2f) || (sVar5 = sVar8 - 1, bVar1 == 0x5c)) break;
  }
  passCount = 0;
  failCount = 0;
  local_328 = pacVar3;
  while( true ) {
    if (local_328 == (char (*) [16])0x0) break;
    if ((this->hasFilter != true) || (local_328[3][0] == '\x01')) {
      message.content.ptr = (char *)(*(long *)(*local_328 + 8) + sVar8);
      local_190 = (char *)CONCAT71(local_190._1_7_,0x3a);
      str<char_const*,char,unsigned_int&,char_const(&)[3],char_const*&>
                (&name,(kj *)&message,&local_190,local_328[1],(uint *)0x19632d,
                 (char (*) [3])(local_328[1] + 8),(char **)CONCAT17(currentFailed,uStack_338));
      params_3 = (char (*) [6])(name.content.size_ + (name.content.size_ == 0));
      params_1 = (char (*) [16])0x9;
      write(this,2,"[ TEST ]",9);
      if (this->listOnly == false) {
        currentFailed = true;
        auVar10 = ::std::chrono::_V2::steady_clock::now();
        local_300 = &local_328;
        local_2f8 = &currentFailed;
        local_308 = this;
        runCatchingExceptions<kj::TestRunner::run()::_lambda()_1_>
                  ((Maybe<kj::Exception> *)&local_190,(kj *)&local_308,auVar10._8_8_);
        _::NullableValue<kj::Exception>::NullableValue
                  ((NullableValue<kj::Exception> *)&message,
                   (NullableValue<kj::Exception> *)&local_190);
        _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_190);
        if ((char)message.content.ptr == '\x01') {
          pPVar2 = this->context;
          str<kj::Exception&>((String *)&local_190,(kj *)&message.content.size_,params);
          pcVar9 = "";
          if (local_188.value.ownFile.content.ptr != (char *)0x0) {
            pcVar9 = local_190;
          }
          (*pPVar2->_vptr_ProcessContext[3])
                    (pPVar2,pcVar9,
                     local_188.value.ownFile.content.ptr +
                     (local_188.value.ownFile.content.ptr == (char *)0x0));
          Array<char>::~Array((Array<char> *)&local_190);
        }
        _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&message);
        lVar7 = ::std::chrono::_V2::steady_clock::now();
        local_190 = (char *)((lVar7 - auVar10._0_8_) / 1000);
        str<kj::String&,char_const(&)[3],long,char_const(&)[6]>
                  (&message,(kj *)&name,(String *)" (",(char (*) [3])&local_190,
                   (long *)anon_var_dwarf_ec61d,params_3);
        if (currentFailed == true) {
          params_1 = (char (*) [16])0x9;
          write(this,0,"[ FAIL ]",9);
          failCount = failCount + 1;
        }
        else {
          params_1 = (char (*) [16])0x9;
          write(this,1,"[ PASS ]",9);
          passCount = passCount + 1;
        }
        Array<char>::~Array((Array<char> *)&message);
      }
      Array<char>::~Array(&name.content);
    }
    local_328 = *(char (**) [16])local_328[2];
  }
  if (passCount != 0) {
    str<unsigned_int&,char_const(&)[16]>
              (&message,(kj *)&passCount,(uint *)" test(s) passed",params_1);
    pcVar9 = "";
    if (message.content.size_ != 0) {
      pcVar9 = message.content.ptr;
    }
    params_1 = (char (*) [16])(message.content.size_ + (message.content.size_ == 0));
    write(this,1,pcVar9,(size_t)params_1);
    Array<char>::~Array(&message.content);
  }
  if (failCount != 0) {
    str<unsigned_int&,char_const(&)[16]>
              (&message,(kj *)&failCount,(uint *)" test(s) failed",params_1);
    pcVar9 = "";
    if (message.content.size_ != 0) {
      pcVar9 = message.content.ptr;
    }
    write(this,0,pcVar9,message.content.size_ + (message.content.size_ == 0));
    Array<char>::~Array(&message.content);
  }
  iVar4 = (*this->context->_vptr_ProcessContext[1])();
  Array<char>::~Array((Array<char> *)&local_190);
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&message);
  Array<char>::~Array(&name.content);
  _Unwind_Resume(iVar4);
}

Assistant:

MainBuilder::Validity run() {
    if (testCasesHead == nullptr) {
      return "no tests were declared";
    }

    // Find the common path prefix of all filenames, so we can strip it off.
    ArrayPtr<const char> commonPrefix = StringPtr(testCasesHead->file);
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      for (size_t i: kj::indices(commonPrefix)) {
        if (testCase->file[i] != commonPrefix[i]) {
          commonPrefix = commonPrefix.slice(0, i);
          break;
        }
      }
    }

    // Back off the prefix to the last '/'.
    while (commonPrefix.size() > 0 && commonPrefix.back() != '/' && commonPrefix.back() != '\\') {
      commonPrefix = commonPrefix.slice(0, commonPrefix.size() - 1);
    }

    // Run the testts.
    uint passCount = 0;
    uint failCount = 0;
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!hasFilter || testCase->matchedFilter) {
        auto name = kj::str(testCase->file + commonPrefix.size(), ':', testCase->line,
                            ": ", testCase->description);

        write(BLUE, "[ TEST ]", name);

        if (!listOnly) {
          bool currentFailed = true;
          auto start = readClock();
          KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
            TestExceptionCallback exceptionCallback(context);
            testCase->run();
            currentFailed = exceptionCallback.failed();
          })) {
            context.error(kj::str(*exception));
          }
          auto end = readClock();

          auto message = kj::str(name, " (", (end - start) / kj::MICROSECONDS, " μs)");

          if (currentFailed) {
            write(RED, "[ FAIL ]", message);
            ++failCount;
          } else {
            write(GREEN, "[ PASS ]", message);
            ++passCount;
          }
        }
      }
    }

    if (passCount > 0) write(GREEN, kj::str(passCount, " test(s) passed"), "");
    if (failCount > 0) write(RED, kj::str(failCount, " test(s) failed"), "");
    context.exit();

    KJ_UNREACHABLE;
  }